

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_aggregate_function.cpp
# Opt level: O1

void duckdb::SortedAggregateState::LinkedAppend
               (LinkedChunkFunctions *functions,ArenaAllocator *allocator,DataChunk *input,
               LinkedLists *linked,SelectionVector *sel,idx_t nsel)

{
  idx_t count;
  const_reference this;
  reference linked_list;
  reference input_00;
  size_type __n;
  ulong uVar1;
  idx_t sidx;
  RecursiveUnifiedVectorFormat input_data;
  ulong local_b0;
  RecursiveUnifiedVectorFormat local_a8;
  
  if ((input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->data).super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
      super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
      super__Vector_impl_data._M_start) {
    count = input->count;
    __n = 0;
    do {
      this = vector<duckdb::ListSegmentFunctions,_true>::operator[](functions,__n);
      linked_list = vector<duckdb::LinkedList,_true>::operator[](linked,__n);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_a8.unified);
      local_a8.children.
      super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      .
      super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_a8.children.
      super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      .
      super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a8.children.
      super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      .
      super__Vector_base<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      LogicalType::LogicalType(&local_a8.logical_type);
      input_00 = vector<duckdb::Vector,_true>::operator[](&input->data,__n);
      Vector::RecursiveToUnifiedFormat(input_00,count,&local_a8);
      if (nsel != 0) {
        uVar1 = 0;
        do {
          local_b0 = uVar1;
          if (sel->sel_vector != (sel_t *)0x0) {
            local_b0 = (ulong)sel->sel_vector[uVar1];
          }
          ListSegmentFunctions::AppendRow(this,allocator,linked_list,&local_a8,&local_b0);
          uVar1 = uVar1 + 1;
        } while (nsel != uVar1);
      }
      LogicalType::~LogicalType(&local_a8.logical_type);
      ::std::
      vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
      ::~vector(&local_a8.children.
                 super_vector<duckdb::RecursiveUnifiedVectorFormat,_std::allocator<duckdb::RecursiveUnifiedVectorFormat>_>
               );
      if (local_a8.unified.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.unified.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_a8.unified.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
          internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_a8.unified.validity.super_TemplatedValidityMask<unsigned_long>.
                   validity_data.internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      __n = __n + 1;
    } while (__n < (ulong)(((long)(input->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(input->data).
                                  super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
                                  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                          0x4ec4ec4ec4ec4ec5));
  }
  return;
}

Assistant:

static void LinkedAppend(const LinkedChunkFunctions &functions, ArenaAllocator &allocator, DataChunk &input,
	                         LinkedLists &linked, SelectionVector &sel, idx_t nsel) {
		const auto count = input.size();
		for (column_t c = 0; c < input.ColumnCount(); ++c) {
			auto &func = functions[c];
			auto &linked_list = linked[c];
			RecursiveUnifiedVectorFormat input_data;
			Vector::RecursiveToUnifiedFormat(input.data[c], count, input_data);
			for (idx_t i = 0; i < nsel; ++i) {
				idx_t sidx = sel.get_index(i);
				func.AppendRow(allocator, linked_list, input_data, sidx);
			}
		}
	}